

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaVCheckCVCSimpleType
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,xmlChar *value,
              xmlSchemaValPtr *retVal,int fireErrors,int normalize,int isNormalized)

{
  xmlSchemaTypeType xVar1;
  uint uVar2;
  xmlSchemaTypePtr pxVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  _xmlSchemaTypeLink *p_Var7;
  ulong uVar8;
  xmlChar *pxVar9;
  byte *pbVar10;
  xmlChar *pxVar11;
  byte *pbVar12;
  xmlSchemaTypePtr item;
  xmlNodePtr node_00;
  xmlSchemaValPtr *ppxVar13;
  char *pcVar14;
  xmlParserErrors error;
  xmlSchemaPtr schema;
  xmlSchemaValidCtxtPtr vctxt;
  byte *name;
  uint displayValue;
  undefined4 in_register_0000008c;
  undefined8 uVar15;
  xmlSchemaValPtr pxVar16;
  long lVar17;
  byte *pbVar18;
  byte bVar19;
  unsigned_long length;
  xmlSchemaValPtr val;
  uint local_7c;
  byte *local_78;
  undefined8 local_70;
  xmlSchemaValPtr curVal;
  byte *local_60;
  undefined8 local_58;
  xmlSchemaTypePtr local_50;
  xmlSchemaValPtr *local_48;
  xmlSchemaTypePtr local_40;
  xmlSchemaValPtr local_38;
  
  uVar15 = CONCAT44(in_register_0000008c,fireErrors);
  val = (xmlSchemaValPtr)0x0;
  local_70 = uVar15;
  if (retVal == (xmlSchemaValPtr *)0x0) {
    bVar19 = (*(byte *)((long)&type->flags + 2) & 0x20) >> 5;
  }
  else {
    bVar19 = 1;
    if (*retVal != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(*retVal);
      *retVal = (xmlSchemaValPtr)0x0;
    }
  }
  displayValue = (uint)uVar15;
  local_7c = (uint)bVar19;
  pbVar18 = (byte *)0x1d124b;
  if (value != (xmlChar *)0x0) {
    pbVar18 = value;
  }
  xVar1 = type->type;
  if (((xVar1 == XML_SCHEMA_TYPE_BASIC) && (type->builtInType == 0x2e)) ||
     (uVar2 = type->flags, (uVar2 >> 8 & 1) != 0)) {
    pxVar3 = type;
    if ((isNormalized == 0) && ((normalize != 0 || ((type->flags & 0x10000000) != 0)))) {
      pbVar12 = xmlSchemaNormalizeValue(type,pbVar18);
      if (pbVar12 != (byte *)0x0) {
        pbVar18 = pbVar12;
      }
      xVar1 = type->type;
    }
    else {
      pbVar12 = (byte *)0x0;
    }
    while (xVar1 != XML_SCHEMA_TYPE_BASIC) {
      pxVar3 = pxVar3->baseType;
      if (pxVar3 == (xmlSchemaTypePtr)0x0) {
        pcVar14 = "could not get the built-in type";
        goto LAB_0018471c;
      }
      xVar1 = pxVar3->type;
    }
    if (actxt->type != 1) {
      if (actxt->type == 2) {
        if (pxVar3->builtInType != 0x15) {
          if (pxVar3->builtInType != 0x1c) goto LAB_00184230;
          schema = (xmlSchemaPtr)actxt[2].dummy;
          node_00 = (xmlNodePtr)0x0;
          vctxt = (xmlSchemaValidCtxtPtr)actxt;
          goto LAB_0018421e;
        }
        curVal = (xmlSchemaValPtr)0x0;
        iVar6 = xmlValidateQName(pbVar18,1);
        if (iVar6 == 0) {
          pbVar10 = xmlSchemaCollapseString(pbVar18);
          name = pbVar10;
          if (pbVar10 == (byte *)0x0) {
            name = pbVar18;
          }
          local_78 = pbVar18;
          pxVar9 = xmlSplitQName2(name,(xmlChar **)&curVal);
          (*xmlFree)(pbVar10);
          if (pxVar9 == (xmlChar *)0x0) {
            pxVar9 = xmlStrdup(local_78);
          }
          pxVar11 = xmlSchemaLookupNamespace((xmlSchemaValidCtxtPtr)actxt,(xmlChar *)curVal);
          if ((curVal == (xmlSchemaValPtr)0x0) || ((*xmlFree)(curVal), pxVar11 != (xmlChar *)0x0)) {
            if (local_7c == 0) {
              (*xmlFree)(pxVar9);
            }
            else {
              if (pxVar11 == (xmlChar *)0x0) {
                iVar5 = 0;
                val = xmlSchemaNewQNameValue((xmlChar *)0x0,pxVar9);
                pbVar18 = local_78;
                goto LAB_001843d3;
              }
              pxVar11 = xmlStrdup(pxVar11);
              val = xmlSchemaNewQNameValue(pxVar11,pxVar9);
            }
            iVar5 = 0;
            pbVar18 = local_78;
          }
          else {
            item = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
            iVar5 = 0x720;
            pbVar18 = local_78;
            xmlSchemaCustomErr(actxt,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1,(xmlNodePtr)0x0,
                               (xmlSchemaBasicItemPtr)item,
                               "The QName value \'%s\' has no corresponding namespace declaration in scope"
                               ,local_78,(xmlChar *)0x0);
            displayValue = (uint)pbVar18;
            pbVar18 = local_78;
            if (pxVar9 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar9);
              pbVar18 = local_78;
            }
          }
        }
        else {
          iVar5 = 0x720;
          if (iVar6 == -1) {
            xmlSchemaInternalErr(actxt,"xmlSchemaValidateQName","calling xmlValidateQName()");
            iVar5 = -1;
          }
        }
        goto LAB_001843d3;
      }
LAB_00184725:
      if (pbVar12 != (byte *)0x0) {
        (*xmlFree)(pbVar12);
      }
LAB_00184736:
      error = ~XML_ERR_OK;
      goto LAB_0018473e;
    }
    if (pxVar3->builtInType != 0x1c) {
LAB_00184230:
      if (local_7c == 0) {
        ppxVar13 = (xmlSchemaValPtr *)0x0;
      }
      else {
        ppxVar13 = &val;
      }
      iVar5 = xmlSchemaValPredefTypeNodeNoNorm(pxVar3,pbVar18,ppxVar13,node);
      goto LAB_001843d3;
    }
    schema = *(xmlSchemaPtr *)(actxt + 4);
    vctxt = (xmlSchemaValidCtxtPtr)0x0;
    node_00 = node;
LAB_0018421e:
    displayValue = local_7c;
    iVar5 = xmlSchemaValidateNotation(vctxt,schema,node_00,pbVar18,&val,local_7c);
LAB_001843d3:
    if (iVar5 == 0) {
      error = XML_ERR_OK;
      if ((type->flags & 0x8000000) != 0) {
        iVar5 = xmlSchemaValidateFacets
                          (actxt,node,type,pxVar3->builtInType,pbVar18,val,0,(int)local_70);
        if (iVar5 != 0) {
          if (iVar5 < 0) {
            pcVar14 = "validating facets of atomic simple type";
            goto LAB_0018471c;
          }
          error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((type->flags & 0x40) == 0);
        }
      }
    }
    else {
      if (iVar5 < 0) {
        pcVar14 = "validating against a built-in type";
LAB_0018471c:
        xmlSchemaInternalErr(actxt,"xmlSchemaVCheckCVCSimpleType",pcVar14);
        goto LAB_00184725;
      }
      error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((type->flags & 0x40) == 0);
      if ((int)local_70 != 0) goto LAB_00184408;
    }
LAB_00184620:
    if (pbVar12 != (byte *)0x0) {
      (*xmlFree)(pbVar12);
    }
    if (error != XML_ERR_OK) goto LAB_0018473e;
  }
  else {
    if ((uVar2 & 0x40) != 0) {
      curVal = (xmlSchemaValPtr)0x0;
      local_78 = pbVar18;
      local_48 = retVal;
      if (isNormalized == 0) {
        if ((uVar2 & 0x10000000) == 0 && normalize == 0) {
          local_58 = CONCAT71((uint7)(uint3)(xVar1 >> 8),1);
          goto LAB_001841df;
        }
        local_60 = xmlSchemaNormalizeValue(type,pbVar18);
        if (local_60 != (byte *)0x0) {
          local_78 = local_60;
        }
        local_58 = 0;
      }
      else {
        local_58 = 0;
LAB_001841df:
        local_60 = (byte *)0x0;
      }
      local_40 = type->subtypes;
      length = 0;
      local_38 = (xmlSchemaValPtr)0x0;
      pbVar18 = local_78;
      local_50 = type;
      do {
        while ((uVar8 = (ulong)*pbVar18, uVar8 < 0x21 && ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0)
               )) {
          pbVar18 = pbVar18 + 1;
        }
        lVar17 = 0;
        while ((0x20 < (byte)uVar8 || ((0x100002601U >> (uVar8 & 0x3f) & 1) == 0))) {
          lVar4 = lVar17 + 1;
          lVar17 = lVar17 + 1;
          uVar8 = (ulong)pbVar18[lVar4];
        }
        if (lVar17 == 0) break;
        pxVar9 = xmlStrndup(pbVar18,(int)lVar17);
        if (local_7c == 0) {
          ppxVar13 = (xmlSchemaValPtr *)0x0;
        }
        else {
          ppxVar13 = &curVal;
        }
        iVar6 = (int)local_70;
        iVar5 = xmlSchemaVCheckCVCSimpleType(actxt,node,local_40,pxVar9,ppxVar13,iVar6,0,1);
        if (pxVar9 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar9);
        }
        if (curVal != (xmlSchemaValPtr)0x0) {
          if (val == (xmlSchemaValPtr)0x0) {
            val = curVal;
            local_38 = curVal;
          }
          else {
            xmlSchemaValueAppend(local_38,curVal);
            local_38 = curVal;
          }
          curVal = (xmlSchemaValPtr)0x0;
        }
        if (iVar5 != 0) {
          if (-1 < iVar5) goto LAB_001844d7;
          pcVar14 = "validating an item of list simple type";
          pbVar12 = local_60;
          goto LAB_0018471c;
        }
        pbVar18 = pbVar18 + lVar17;
        length = length + 1;
      } while (*pbVar18 != 0);
      error = XML_ERR_OK;
      pbVar12 = local_60;
      retVal = local_48;
      if ((local_50->flags & 0x8000000) != 0) {
        error = XML_ERR_OK;
        pxVar16 = val;
        iVar5 = xmlSchemaValidateFacets
                          (actxt,node,local_50,XML_SCHEMAS_UNKNOWN,local_78,val,length,(int)local_70
                          );
        iVar6 = (int)pxVar16;
        pbVar12 = local_60;
        retVal = local_48;
        if (iVar5 != 0) {
          if (iVar5 < 0) {
            pcVar14 = "validating facets of list simple type";
            goto LAB_0018471c;
          }
LAB_001844d7:
          retVal = local_48;
          pxVar3 = local_50;
          pbVar18 = local_78;
          if ((int)local_70 == 0) {
            error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
            pbVar12 = local_60;
          }
          else {
            if (((char)local_58 != '\0') &&
               (local_60 = xmlSchemaNormalizeValue(local_50,local_78), local_60 != (byte *)0x0)) {
              pbVar18 = local_60;
            }
            error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
            xmlSchemaSimpleTypeErr
                      (actxt,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2,node,pbVar18,pxVar3,iVar6);
            pbVar12 = local_60;
          }
        }
      }
      goto LAB_00184620;
    }
    if ((char)uVar2 < '\0') {
      p_Var7 = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
      if (p_Var7 == (xmlSchemaTypeLinkPtr)0x0) {
        pcVar14 = "union simple type has no member types";
LAB_00184703:
        xmlSchemaInternalErr(actxt,"xmlSchemaVCheckCVCSimpleType",pcVar14);
        goto LAB_00184736;
      }
      iVar5 = 0;
      for (; displayValue = (uint)uVar15, p_Var7 != (xmlSchemaTypeLinkPtr)0x0; p_Var7 = p_Var7->next
          ) {
        ppxVar13 = &val;
        if (local_7c == 0) {
          ppxVar13 = (xmlSchemaValPtr *)0x0;
        }
        uVar15 = 0;
        iVar5 = xmlSchemaVCheckCVCSimpleType(actxt,node,p_Var7->type,pbVar18,ppxVar13,0,1,0);
        displayValue = (uint)uVar15;
        if (iVar5 < 1) break;
      }
      if (iVar5 == 0) {
        if (((uint)type->flags >> 0x1b & 1) == 0) goto LAB_00184639;
        error = XML_ERR_OK;
        if ((isNormalized == 0) && ((type->flags & 0x10000000U) != 0 || normalize != 0)) {
          pbVar12 = xmlSchemaNormalizeValue(p_Var7->type,pbVar18);
          if (pbVar12 != (byte *)0x0) {
            pbVar18 = pbVar12;
          }
        }
        else {
          pbVar12 = (byte *)0x0;
        }
        pxVar16 = val;
        iVar5 = xmlSchemaValidateFacets
                          (actxt,node,type,XML_SCHEMAS_UNKNOWN,pbVar18,val,0,(int)local_70);
        displayValue = (uint)pxVar16;
        if (iVar5 == 0) goto LAB_00184620;
        if (-1 < iVar5) goto LAB_00184527;
        pcVar14 = "validating facets of union simple type";
        goto LAB_0018471c;
      }
      if (iVar5 < 0) {
        pcVar14 = "validating members of union simple type";
        goto LAB_00184703;
      }
      pbVar12 = (byte *)0x0;
LAB_00184527:
      if ((int)local_70 == 0) {
        error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
        goto LAB_00184620;
      }
      error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
LAB_00184408:
      xmlSchemaSimpleTypeErr(actxt,error,node,pbVar18,type,displayValue);
      goto LAB_00184620;
    }
  }
LAB_00184639:
  if (retVal != (xmlSchemaValPtr *)0x0) {
    *retVal = val;
    return 0;
  }
  error = XML_ERR_OK;
LAB_0018473e:
  if (val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(val);
  }
  return error;
}

Assistant:

static int
xmlSchemaVCheckCVCSimpleType(xmlSchemaAbstractCtxtPtr actxt,
			     xmlNodePtr node,
			     xmlSchemaTypePtr type,
			     const xmlChar *value,
			     xmlSchemaValPtr *retVal,
			     int fireErrors,
			     int normalize,
			     int isNormalized)
{
    int ret = 0, valNeeded = (retVal) ? 1 : 0;
    xmlSchemaValPtr val = NULL;
    /* xmlSchemaWhitespaceValueType ws; */
    xmlChar *normValue = NULL;

#define NORMALIZE(atype) \
    if ((! isNormalized) && \
    (normalize || (type->flags & XML_SCHEMAS_TYPE_NORMVALUENEEDED))) { \
	normValue = xmlSchemaNormalizeValue(atype, value); \
	if (normValue != NULL) \
	    value = normValue; \
	isNormalized = 1; \
    }

    if ((retVal != NULL) && (*retVal != NULL)) {
	xmlSchemaFreeValue(*retVal);
	*retVal = NULL;
    }
    /*
    * 3.14.4 Simple Type Definition Validation Rules
    * Validation Rule: String Valid
    */
    /*
    * 1 It is schema-valid with respect to that definition as defined
    * by Datatype Valid in [XML Schemas: Datatypes].
    */
    /*
    * 2.1 If The definition is ENTITY or is validly derived from ENTITY given
    * the empty set, as defined in Type Derivation OK (Simple) ($3.14.6), then
    * the string must be a `declared entity name`.
    */
    /*
    * 2.2 If The definition is ENTITIES or is validly derived from ENTITIES
    * given the empty set, as defined in Type Derivation OK (Simple) ($3.14.6),
    * then every whitespace-delimited substring of the string must be a `declared
    * entity name`.
    */
    /*
    * 2.3 otherwise no further condition applies.
    */
    if ((! valNeeded) && (type->flags & XML_SCHEMAS_TYPE_FACETSNEEDVALUE))
	valNeeded = 1;
    if (value == NULL)
	value = BAD_CAST "";
    if (WXS_IS_ANY_SIMPLE_TYPE(type) || WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr biType; /* The built-in type. */
	/*
	* SPEC (1.2.1) "if {variety} is `atomic` then the string must `match`
	* a literal in the `lexical space` of {base type definition}"
	*/
	/*
	* Whitespace-normalize.
	*/
	NORMALIZE(type);
	if (type->type != XML_SCHEMA_TYPE_BASIC) {
	    /*
	    * Get the built-in type.
	    */
	    biType = type->baseType;
	    while ((biType != NULL) &&
		(biType->type != XML_SCHEMA_TYPE_BASIC))
		biType = biType->baseType;

	    if (biType == NULL) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "could not get the built-in type");
		goto internal_error;
	    }
	} else
	    biType = type;
	/*
	* NOTATIONs need to be processed here, since they need
	* to lookup in the hashtable of NOTATION declarations of the schema.
	*/
	if (actxt->type == XML_SCHEMA_CTXT_VALIDATOR) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(
			(xmlSchemaValidCtxtPtr) actxt,
			((xmlSchemaValidCtxtPtr) actxt)->schema,
			NULL, value, &val, valNeeded);
		    break;
		case XML_SCHEMAS_QNAME:
		    ret = xmlSchemaValidateQName((xmlSchemaValidCtxtPtr) actxt,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else if (actxt->type == XML_SCHEMA_CTXT_PARSER) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(NULL,
			((xmlSchemaParserCtxtPtr) actxt)->schema, node,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else {
	    /*
	    * Validation via a public API is not implemented yet.
	    */
	    goto internal_error;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating against a built-in type");
		goto internal_error;
	    }
	    if (WXS_IS_LIST(type))
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    else
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	}
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Check facets.
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		(xmlSchemaValType) biType->builtInType, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of atomic simple type");
		    goto internal_error;
		}
		if (WXS_IS_LIST(type))
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		else
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	    }
	}
	else if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    } else if (WXS_IS_LIST(type)) {

	xmlSchemaTypePtr itemType;
	const xmlChar *cur, *end;
	xmlChar *tmpValue = NULL;
	unsigned long len = 0;
	xmlSchemaValPtr prevVal = NULL, curVal = NULL;
	/* 1.2.2 if {variety} is `list` then the string must be a sequence
	* of white space separated tokens, each of which `match`es a literal
	* in the `lexical space` of {item type definition}
	*/
	/*
	* Note that XML_SCHEMAS_TYPE_NORMVALUENEEDED will be set if
	* the list type has an enum or pattern facet.
	*/
	NORMALIZE(type);
	/*
	* VAL TODO: Optimize validation of empty values.
	* VAL TODO: We do not have computed values for lists.
	*/
	itemType = WXS_LIST_ITEMTYPE(type);
	cur = value;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    tmpValue = xmlStrndup(cur, end - cur);
	    len++;

	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, &curVal, fireErrors, 0, 1);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, NULL, fireErrors, 0, 1);
	    FREE_AND_NULL(tmpValue);
	    if (curVal != NULL) {
		/*
		* Add to list of computed values.
		*/
		if (val == NULL)
		    val = curVal;
		else
		    xmlSchemaValueAppend(prevVal, curVal);
		prevVal = curVal;
		curVal = NULL;
	    }
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating an item of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		break;
	    }
	    cur = end;
	} while (*cur != 0);
	FREE_AND_NULL(tmpValue);
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Apply facets (pattern, enumeration).
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		len, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    }
	}
	if (fireErrors && (ret > 0)) {
	    /*
	    * Report the normalized value.
	    */
	    normalize = 1;
	    NORMALIZE(type);
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
	}
    } else if (WXS_IS_UNION(type)) {
	xmlSchemaTypeLinkPtr memberLink;
	/*
	* TODO: For all datatypes `derived` by `union`  whiteSpace does
	* not apply directly; however, the normalization behavior of `union`
	* types is controlled by the value of whiteSpace on that one of the
	* `memberTypes` against which the `union` is successfully validated.
	*
	* This means that the value is normalized by the first validating
	* member type, then the facets of the union type are applied. This
	* needs changing of the value!
	*/

	/*
	* 1.2.3 if {variety} is `union` then the string must `match` a
	* literal in the `lexical space` of at least one member of
	* {member type definitions}
	*/
	memberLink = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
	if (memberLink == NULL) {
	    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		"union simple type has no member types");
	    goto internal_error;
	}
	/*
	* Always normalize union type values, since we currently
	* cannot store the whitespace information with the value
	* itself; otherwise a later value-comparison would be
	* not possible.
	*/
	while (memberLink != NULL) {
	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, &val, 0, 1, 0);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, NULL, 0, 1, 0);
	    if (ret <= 0)
		break;
	    memberLink = memberLink->next;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating members of union simple type");
		goto internal_error;
	    }
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	}
	/*
	* Apply facets (pattern, enumeration).
	*/
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * The normalization behavior of `union` types is controlled by
	    * the value of whiteSpace on that one of the `memberTypes`
	    * against which the `union` is successfully validated.
	    */
	    NORMALIZE(memberLink->type);
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of union simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	    }
	}
	if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    }

    if (normValue != NULL)
	xmlFree(normValue);
    if (ret == 0) {
	if (retVal != NULL)
	    *retVal = val;
	else if (val != NULL)
	    xmlSchemaFreeValue(val);
    } else if (val != NULL)
	xmlSchemaFreeValue(val);
    return (ret);
internal_error:
    if (normValue != NULL)
	xmlFree(normValue);
    if (val != NULL)
	xmlSchemaFreeValue(val);
    return (-1);
}